

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  uint uVar1;
  SessionHandle *data_00;
  _Bool _Var2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  SessionHandle *data;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  curl_socklen_t len;
  int error;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (conn->socktype == 2) {
    return;
  }
  if (((conn->bits).reuse & 1U) == 0) {
    ssrem.buffer.sa_stor.__ss_align._4_4_ = 0x80;
    iVar3 = getpeername(sockfd,(sockaddr *)((long)&ssloc.buffer + 0x78),
                        (socklen_t *)((long)&ssrem.buffer.sa_stor.__ss_align + 4));
    if (iVar3 != 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(conn,uVar1);
      Curl_failf(data_00,"getpeername() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    ssrem.buffer.sa_stor.__ss_align._4_4_ = 0x80;
    iVar3 = getsockname(sockfd,(sockaddr *)&data,
                        (socklen_t *)((long)&ssrem.buffer.sa_stor.__ss_align + 4));
    if (iVar3 != 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(conn,uVar1);
      Curl_failf(data_00,"getsockname() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    _Var2 = getaddressinfo((sockaddr *)((long)&ssloc.buffer + 0x78),conn->primary_ip,
                           &conn->primary_port);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(conn,uVar1);
      Curl_failf(data_00,"ssrem inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
    memcpy(conn->ip_addr_str,conn->primary_ip,0x2e);
    _Var2 = getaddressinfo((sockaddr *)&data,conn->local_ip,&conn->local_port);
    if (!_Var2) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      pcVar5 = Curl_strerror(conn,uVar1);
      Curl_failf(data_00,"ssloc inet_ntop() failed with errno %d: %s",(ulong)uVar1,pcVar5);
      return;
    }
  }
  Curl_persistconninfo(conn);
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  int error;
  curl_socklen_t len;
  struct Curl_sockaddr_storage ssrem;
  struct Curl_sockaddr_storage ssloc;
  struct SessionHandle *data = conn->data;

  if(conn->socktype == SOCK_DGRAM)
    /* there's no connection! */
    return;

  if(!conn->bits.reuse) {

    len = sizeof(struct Curl_sockaddr_storage);
    if(getpeername(sockfd, (struct sockaddr*) &ssrem, &len)) {
      error = SOCKERRNO;
      failf(data, "getpeername() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    len = sizeof(struct Curl_sockaddr_storage);
    if(getsockname(sockfd, (struct sockaddr*) &ssloc, &len)) {
      error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    if(!getaddressinfo((struct sockaddr*)&ssrem,
                        conn->primary_ip, &conn->primary_port)) {
      error = ERRNO;
      failf(data, "ssrem inet_ntop() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }
    memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);

    if(!getaddressinfo((struct sockaddr*)&ssloc,
                       conn->local_ip, &conn->local_port)) {
      error = ERRNO;
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

  }

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}